

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void newt_option(char *s)

{
  int iVar1;
  int wlen;
  char *s_local;
  
  iVar1 = lookup_words(reserved_words,5,s);
  switch(iVar1) {
  case 1:
    newt_env.mode.nos2 = true;
    break;
  case 2:
    newt_show_copyright();
    exit(0);
  case 3:
    newt_show_version();
    exit(0);
  case 4:
    newt_show_staff();
    exit(0);
  }
  return;
}

Assistant:

void newt_option(const char * s)
{
    int	wlen;
    
    wlen = sizeof(reserved_words) / sizeof(keyword_t);
    
    switch (lookup_words(reserved_words, wlen, s))
    {
            // NOS2 コンパチブル
        case optNos2:
            NEWT_MODE_NOS2 = true;
            break;
            
            // コピーライト
        case optCopyright:
            newt_show_copyright();
            exit(0);
            break;
            
            // バージョン
        case optVersion:
            newt_show_version();
            exit(0);
            break;
            
            // スタッフロール
        case optStaff:
            newt_show_staff();
            exit(0);
            break;
    }
}